

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_optTests.cpp
# Opt level: O0

void __thiscall
shared_guarded_opt_shared_guarded_1_Test::~shared_guarded_opt_shared_guarded_1_Test
          (shared_guarded_opt_shared_guarded_1_Test *this)

{
  shared_guarded_opt_shared_guarded_1_Test *this_local;
  
  ~shared_guarded_opt_shared_guarded_1_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(shared_guarded_opt, shared_guarded_1)
{
    shared_guarded_opt<int, shared_mutex> data(true, 0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        /* These tests must be done from another thread, because on
           glibc std::mutex is actually a recursive mutex. */

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_until(std::chrono::steady_clock::now() +
                                    std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (!data_handle2) {
                th1_ok = false;
            }
            if (*data_handle2 != 1) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (!data_handle2) {
                th2_ok = false;
            }
            if (*data_handle2 != 1) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (!data_handle2) {
                th3_ok = false;
            }
            if (*data_handle2 != 1) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }
}